

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O2

KTXTexture2 __thiscall
ktx::transcode<false>
          (ktx *this,KTXTexture2 *texture,OptionsTranscodeTarget<false> *options,Reporter *report)

{
  bool bVar1;
  int iVar2;
  ktx_transcode_fmt_e *pkVar3;
  ktxTexture2 *pkVar4;
  Color *pCVar5;
  byte bVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  KTXTexture2 *pKVar12;
  uint uVar13;
  string_view swizzle;
  string_view swizzle_00;
  string_view swizzle_01;
  string_view swizzle_02;
  KTXTexture2 convertedTexture;
  r8image dstImage;
  rgba8image srcImage;
  ktx_size_t dstImageOffset;
  ktx_size_t srcImageOffset;
  
  OptionsTranscodeTarget<false>::validateTextureTranscode(options,texture,report);
  pkVar4 = texture->handle_;
  pkVar3 = std::optional<ktx_transcode_fmt_e>::value(&options->transcodeTarget);
  iVar2 = ktxTexture2_TranscodeBasis(pkVar4,*pkVar3,0);
  if (iVar2 != 0) {
    srcImage.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar2);
    Reporter::fatal<char_const(&)[37],char_const*>
              (report,INVALID_FILE,(char (*) [37])"Failed to transcode KTX2 texture: {}",
               (char **)&srcImage);
  }
  uVar8 = options->transcodeSwizzleComponents;
  pKVar12 = texture;
  if (uVar8 == 0) {
    convertedTexture.handle_ = (ktxTexture2 *)0x0;
  }
  else {
    if (uVar8 == 4) {
      bVar1 = std::operator!=(&options->transcodeSwizzle,"rgba");
      convertedTexture.handle_ = (ktxTexture2 *)0x0;
      if (!bVar1) goto LAB_0017856c;
    }
    else {
      convertedTexture.handle_ = (ktxTexture2 *)0x0;
      srcImage.freePixels = false;
      srcImage._33_7_ = 0;
      srcImage.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
      srcImage.super_Image.primaries = KHR_DF_PRIMARIES_UNSPECIFIED;
      srcImage.pixels = (Color *)0x0;
      srcImage.super_Image._vptr_Image = (_func_int **)0x0;
      srcImage.super_Image.width = 0;
      srcImage.super_Image.height = 0;
      pkVar4 = texture->handle_;
      if (uVar8 == 3) {
        uVar10 = 0x1d;
        uVar7 = 0x17;
      }
      else if (uVar8 == 2) {
        uVar10 = 0x16;
        uVar7 = 0x10;
      }
      else {
        if (uVar8 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                        ,0x7d,
                        "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                       );
        }
        uVar10 = 0xf;
        uVar7 = 9;
      }
      if (pkVar4->vkFormat == 0x2b) {
        uVar7 = uVar10;
      }
      srcImage.super_Image._vptr_Image = (_func_int **)((ulong)uVar7 << 0x20);
      srcImage.super_Image.transferFunction = pkVar4->baseWidth;
      srcImage.super_Image.primaries = pkVar4->baseHeight;
      srcImage.pixels = *(Color **)&pkVar4->baseDepth;
      srcImage._32_8_ = *(undefined8 *)&pkVar4->numLevels;
      srcImage.super_Image.width = 0;
      srcImage.super_Image.height = 0;
      iVar2 = ktxTexture2_Create(&srcImage,1,&convertedTexture);
      if (iVar2 != 0) {
        dstImage.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar2);
        Reporter::fatal<char_const(&)[36],char_const*>
                  (report,IO_FAILURE,(char (*) [36])"Failed to create output texture: {}",
                   (char **)&dstImage);
      }
      pKVar12 = &convertedTexture;
      if (convertedTexture.handle_ == (ktxTexture2 *)0x0) {
        pKVar12 = texture;
      }
    }
    pkVar4 = texture->handle_;
    for (uVar10 = 0; uVar10 < pkVar4->numLevels; uVar10 = uVar10 + 1) {
      bVar6 = (byte)uVar10;
      uVar7 = pkVar4->baseWidth >> (bVar6 & 0x1f);
      uVar8 = uVar7 + (uVar7 == 0);
      uVar7 = pkVar4->baseHeight >> (bVar6 & 0x1f);
      uVar11 = uVar7 + (uVar7 == 0);
      uVar7 = pkVar4->baseDepth >> (bVar6 & 0x1f);
      for (uVar13 = 0; uVar13 < pkVar4->numFaces; uVar13 = uVar13 + 1) {
        for (uVar9 = 0; uVar9 < pkVar4->numLayers; uVar9 = uVar9 + 1) {
          for (iVar2 = 0; uVar7 + (uVar7 == 0) != iVar2; iVar2 = iVar2 + 1) {
            (*texture->handle_->vtbl->GetImageOffset)
                      ((ktxTexture *)texture->handle_,uVar10,uVar9,uVar13 + iVar2,&srcImageOffset);
            (*pKVar12->handle_->vtbl->GetImageOffset)
                      ((ktxTexture *)pKVar12->handle_,uVar10,uVar9,uVar13 + iVar2,&dstImageOffset);
            srcImage.pixels = (Color *)(texture->handle_->pData + srcImageOffset);
            pCVar5 = (Color *)(pKVar12->handle_->pData + dstImageOffset);
            srcImage.super_Image.height = uVar11;
            srcImage.super_Image.width = uVar8;
            srcImage.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
            srcImage.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
            srcImage.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00241838;
            srcImage._32_8_ = srcImage._32_8_ & 0xffffffffffffff00;
            switch(options->transcodeSwizzleComponents) {
            case 1:
              dstImage.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
              dstImage.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
              dstImage.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_002424a0;
              dstImage.freePixels = false;
              swizzle_00._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
              swizzle_00._M_len = (options->transcodeSwizzle)._M_string_length;
              dstImage.super_Image.width = uVar8;
              dstImage.super_Image.height = uVar11;
              dstImage.pixels = (Color *)pCVar5;
              ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,1u>>
                        ((ImageT<unsigned_char,4u> *)&srcImage,&dstImage,swizzle_00);
              ImageT<unsigned_char,_1U>::~ImageT(&dstImage);
              break;
            case 2:
              dstImage.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
              dstImage.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
              dstImage.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00242598;
              dstImage.freePixels = false;
              swizzle_02._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
              swizzle_02._M_len = (options->transcodeSwizzle)._M_string_length;
              dstImage.super_Image.width = uVar8;
              dstImage.super_Image.height = uVar11;
              dstImage.pixels = (Color *)pCVar5;
              ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,2u>>
                        ((ImageT<unsigned_char,4u> *)&srcImage,
                         (ImageT<unsigned_char,_2U> *)&dstImage,swizzle_02);
              ImageT<unsigned_char,_2U>::~ImageT((ImageT<unsigned_char,_2U> *)&dstImage);
              break;
            case 3:
              dstImage.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
              dstImage.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
              dstImage.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00242690;
              dstImage.freePixels = false;
              swizzle_01._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
              swizzle_01._M_len = (options->transcodeSwizzle)._M_string_length;
              dstImage.super_Image.width = uVar8;
              dstImage.super_Image.height = uVar11;
              dstImage.pixels = (Color *)pCVar5;
              ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,3u>>
                        ((ImageT<unsigned_char,4u> *)&srcImage,
                         (ImageT<unsigned_char,_3U> *)&dstImage,swizzle_01);
              ImageT<unsigned_char,_3U>::~ImageT((ImageT<unsigned_char,_3U> *)&dstImage);
              break;
            case 4:
              if (srcImage.pixels != pCVar5) {
                __assert_fail("srcImageData == dstImageData",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                              ,0xb6,
                              "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                             );
              }
              swizzle._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
              swizzle._M_len = (options->transcodeSwizzle)._M_string_length;
              ImageT<unsigned_char,_4U>::swizzle(&srcImage,swizzle);
              break;
            default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                            ,0xbb,
                            "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                           );
            }
            ImageT<unsigned_char,_4U>::~ImageT(&srcImage);
          }
          pkVar4 = texture->handle_;
        }
      }
    }
  }
LAB_0017856c:
  *(ktxTexture2 **)this = pKVar12->handle_;
  pKVar12->handle_ = (ktxTexture2 *)0x0;
  KTXTexture2::~KTXTexture2(&convertedTexture);
  return (KTXTexture2)(ktxTexture2 *)this;
}

Assistant:

KTXTexture2 transcode(KTXTexture2&& texture, OptionsTranscodeTarget<TRANSCODE_CMD>& options, Reporter& report) {
    options.validateTextureTranscode(texture, report);

    auto ret = ktxTexture2_TranscodeBasis(texture, options.transcodeTarget.value(), 0);
    if (ret != KTX_SUCCESS)
        report.fatal(rc::INVALID_FILE, "Failed to transcode KTX2 texture: {}", ktxErrorString(ret));

    // Need to perform format conversion and swizzling if needed
    bool needFormatConversion = false;
    bool needSwizzle = false;
    if (options.transcodeSwizzleComponents != 0) {
        if (options.transcodeSwizzleComponents == 4) {
            if (options.transcodeSwizzle != "rgba") {
                needSwizzle = true;
            }
        } else {
            needFormatConversion = true;
            needSwizzle = true;
        }
    }

    KTXTexture2 convertedTexture{nullptr};
    if (needFormatConversion) {
        ktxTextureCreateInfo createInfo;
        std::memset(&createInfo, 0, sizeof(createInfo));

        const bool srgb = (texture->vkFormat == VK_FORMAT_R8G8B8A8_SRGB);
        switch (options.transcodeSwizzleComponents) {
        case 1:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8_SRGB : VK_FORMAT_R8_UNORM;
            break;
        case 2:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8_SRGB : VK_FORMAT_R8G8_UNORM;
            break;
        case 3:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8B8_SRGB : VK_FORMAT_R8G8B8_UNORM;
            break;
        default:
            assert(false);
        }

        createInfo.baseWidth = texture->baseWidth;
        createInfo.baseHeight = texture->baseHeight;
        createInfo.baseDepth = texture->baseDepth;
        createInfo.generateMipmaps = texture->generateMipmaps;
        createInfo.isArray = texture->isArray;
        createInfo.numDimensions = texture->numDimensions;
        createInfo.numFaces = texture->numFaces;
        createInfo.numLayers = texture->numLayers;
        createInfo.numLevels = texture->numLevels;
        createInfo.pDfd = nullptr;

        ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, convertedTexture.pHandle());
        if (KTX_SUCCESS != ret)
            report.fatal(rc::IO_FAILURE, "Failed to create output texture: {}", ktxErrorString(ret));
    }

    KTXTexture2& outputTexture = (convertedTexture.handle() != nullptr) ? convertedTexture : texture;
    if (needFormatConversion || needSwizzle) {
        for (uint32_t levelIndex = 0; levelIndex < texture->numLevels; ++levelIndex) {
            const auto imageWidth = std::max(1u, texture->baseWidth >> levelIndex);
            const auto imageHeight = std::max(1u, texture->baseHeight >> levelIndex);
            const auto imageDepth = std::max(1u, texture->baseDepth >> levelIndex);

            for (uint32_t faceIndex = 0; faceIndex < texture->numFaces; ++faceIndex) {
                for (uint32_t layerIndex = 0; layerIndex < texture->numLayers; ++layerIndex) {
                    for (uint32_t depthIndex = 0; depthIndex < imageDepth; ++depthIndex) {
                        ktx_size_t srcImageOffset;
                        ktxTexture_GetImageOffset(texture, levelIndex, layerIndex, faceIndex + depthIndex, &srcImageOffset);
                        ktx_size_t dstImageOffset;
                        ktxTexture_GetImageOffset(outputTexture, levelIndex, layerIndex, faceIndex + depthIndex, &dstImageOffset);

                        auto srcImageData = texture->pData + srcImageOffset;
                        auto dstImageData = outputTexture->pData + dstImageOffset;

                        rgba8image srcImage(imageWidth, imageHeight, reinterpret_cast<rgba8color*>(srcImageData));

                        switch (options.transcodeSwizzleComponents) {
                        case 1: {
                            r8image dstImage(imageWidth, imageHeight, reinterpret_cast<r8color*>(dstImageData));
                            srcImage.copyToR(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 2: {
                            rg8image dstImage(imageWidth, imageHeight, reinterpret_cast<rg8color*>(dstImageData));
                            srcImage.copyToRG(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 3: {
                            rgb8image dstImage(imageWidth, imageHeight, reinterpret_cast<rgb8color*>(dstImageData));
                            srcImage.copyToRGB(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 4: {
                            // Swizzle in-place
                            assert(srcImageData == dstImageData);
                            srcImage.swizzle(options.transcodeSwizzle);
                            break;
                        }
                        default:
                            assert(false);
                        }
                    }
                }
            }
        }
    }

    return std::move(outputTexture);
}